

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::IfcEdgeCurve(IfcEdgeCurve *this)

{
  IfcEdgeCurve *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x78,"IfcEdgeCurve");
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__00e1b428);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdgeCurve,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdgeCurve,_2UL> *)
             &(this->super_IfcEdge).field_0x40,&PTR_construction_vtable_24__00e1b4a0);
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xe1b370;
  *(undefined8 *)&this->field_0x78 = 0xe1b410;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xe1b398;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xe1b3c0;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0xe1b3e8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcEdge).field_0x50,
             (LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->SameSense);
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}